

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O2

void __thiscall Node::OutputRemark(Node *this,ostream *os)

{
  char cVar1;
  ostream *poVar2;
  char *pcVar3;
  string Remark;
  string local_40;
  
  std::__cxx11::string::string((string *)&Remark,(string *)&this->TextValue);
  cVar1 = *Remark._M_dataplus._M_p;
  if (cVar1 == '!') {
    std::__cxx11::string::erase((ulong)&Remark,0);
    cVar1 = *Remark._M_dataplus._M_p;
  }
  if (cVar1 == ' ') {
    std::__cxx11::string::erase((ulong)&Remark,0);
  }
  pcVar3 = "//";
LAB_00114758:
  do {
    if (Remark._M_string_length == 0) {
LAB_001147dd:
      poVar2 = std::operator<<(os,pcVar3);
      std::operator<<(poVar2,(string *)&Remark);
      if (this->Tree[0] != (Node *)0x0) {
        poVar2 = std::operator<<(os,' ');
        Expression_abi_cxx11_(&local_40,this->Tree[0]);
        std::operator<<(poVar2,(string *)&local_40);
        std::__cxx11::string::~string((string *)&local_40);
      }
      std::endl<char,std::char_traits<char>>(os);
      std::__cxx11::string::~string((string *)&Remark);
      return;
    }
    cVar1 = Remark._M_dataplus._M_p[Remark._M_string_length - 1];
    if (cVar1 != '\t') {
      if ((cVar1 == '\n') || (cVar1 == '\r')) {
        std::__cxx11::string::erase(&Remark);
      }
      else if (cVar1 == ' ') {
        std::__cxx11::string::erase(&Remark);
      }
      else if (cVar1 == '!') {
        std::__cxx11::string::erase(&Remark);
      }
      else {
        if (cVar1 != '&') {
          pcVar3 = "// ";
          if (*Remark._M_dataplus._M_p == '*') {
            pcVar3 = "//";
          }
          if (*Remark._M_dataplus._M_p == '\t') {
            pcVar3 = "//";
          }
          goto LAB_001147dd;
        }
        std::__cxx11::string::erase(&Remark);
      }
      goto LAB_00114758;
    }
    std::__cxx11::string::erase(&Remark);
  } while( true );
}

Assistant:

void Node::OutputRemark(
	std::ostream& os	/**< iostream to write C++ code to */
)
{
	std::string Remark = TextValue;

	//
	// Skip start of remark character
	//
	if (Remark[0] == '!')
	{
#ifdef STLREMOVE
		Remark.remove(0,1);
#else
		Remark.erase(0,1);
#endif
	}

	//
	// Skip extra white space
	//
	if (Remark[0] == ' ')
	{
#ifdef STLREMOVE
		Remark.remove(0,1);
#else
		Remark.erase(0,1);
#endif
	}

	//
	// Lose any junk at end of comment
	// (Yes, it does modify the original value)
	//
	while(Remark.length() > 0)
	{
		// Line continuation marker
		if (*(Remark.end() - 1) == '&')
		{
#ifdef STLREMOVE
			Remark.remove(Remark.end() - 1);
#else
			Remark.erase(Remark.end() - 1);
#endif
			continue;
		}

		// New Line
		if ((*(Remark.end() - 1) == '\n') ||
			(*(Remark.end() - 1) == '\r'))
		{
#ifdef STLREMOVE
			Remark.remove(Remark.end() - 1);
#else
			Remark.erase(Remark.end() - 1);
#endif
			continue;
		}

		// Space
		if (*(Remark.end() - 1) == ' ')
		{
#ifdef STLREMOVE
			Remark.remove(Remark.end() - 1);
#else
			Remark.erase(Remark.end() - 1);
#endif
			continue;
		}

		// Tab
		if (*(Remark.end() - 1) == '\t')
		{
#ifdef STLREMOVE
			Remark.remove(Remark.end() - 1);
#else
			Remark.erase(Remark.end() - 1);
#endif
			continue;
		}

		// Exclimation point
		if (*(Remark.end() - 1) == '!')
		{
#ifdef STLREMOVE
			Remark.remove(Remark.end() - 1);
#else
			Remark.erase(Remark.end() - 1);
#endif
			continue;
		}

		// Break out of loop
		break;
	}

	//
	// Dump out remark (and maybe add a space to the front)
	//
	if ((Remark.length() == 0) || (Remark[0] == '\t') || (Remark[0] == '*'))
	{
		os << "//" << Remark;
	}
	else
	{
		os << "// " << Remark;
	}

	//
	// There may be some extra stuff that needs printing
	//
	if (Tree[0] != 0)
	{
		os << ' ' << Tree[0]->Expression();
	}

	os << std::endl;

}